

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>
::ExportConstraint(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>
                   *this,int i_con,Container *cnt)

{
  BasicLogger *pBVar1;
  BasicMemoryWriter<char,_std::allocator<char>_> *s;
  MemoryWriter wrt;
  BasicConstraintKeeper *in_stack_fffffffffffffd90;
  BasicMemoryWriter<char,_std::allocator<char>_> *this_00;
  BasicCStringRef<char> local_260;
  allocator<char> *in_stack_fffffffffffffda8;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  BasicWriter<char> *in_stack_fffffffffffffdb8;
  BasicCStringRef<char> in_stack_fffffffffffffdc0;
  Container *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea4;
  MemoryWriter *in_stack_fffffffffffffea8;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>
  *in_stack_fffffffffffffeb0;
  
  pBVar1 = BasicConstraintKeeper::GetLogger(in_stack_fffffffffffffd90);
  if (pBVar1 != (BasicLogger *)0x0) {
    this_00 = (BasicMemoryWriter<char,_std::allocator<char>_> *)&stack0xfffffffffffffdbf;
    std::allocator<char>::allocator();
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdbf);
    WriteCon2JSON(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                  in_stack_fffffffffffffe98);
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_260,"\n");
    fmt::BasicWriter<char>::write<>(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
    s = (BasicMemoryWriter<char,_std::allocator<char>_> *)
        BasicConstraintKeeper::GetLogger((BasicConstraintKeeper *)this_00);
    BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>((BasicLogger *)this_00,s)
    ;
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this_00);
  }
  return;
}

Assistant:

void ExportConstraint(int i_con, const Container& cnt) {
    if (GetLogger()) {
      fmt::MemoryWriter wrt;
      WriteCon2JSON(wrt, i_con, cnt);
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }